

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mandelbrot.cpp
# Opt level: O3

void save_image(string *filename,vector<PixelColor,_std::allocator<PixelColor>_> *image_data)

{
  uchar uVar1;
  uchar uVar2;
  pointer pPVar3;
  char cVar4;
  ostream *poVar5;
  runtime_error *this;
  pointer pPVar6;
  ofstream out;
  uchar local_231;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(string *)filename,_S_bin);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    pPVar6 = (image_data->super__Vector_base<PixelColor,_std::allocator<PixelColor>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pPVar3 = (image_data->super__Vector_base<PixelColor,_std::allocator<PixelColor>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar6 != pPVar3) {
      do {
        local_231 = pPVar6->r;
        uVar1 = pPVar6->g;
        uVar2 = pPVar6->b;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(char *)&local_231,1);
        local_231 = uVar1;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_231,1);
        local_231 = uVar2;
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_231,1);
        pPVar6 = pPVar6 + 1;
      } while (pPVar6 != pPVar3);
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"unable to open output file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void save_image(const std::string& filename, const std::vector<PixelColor>& image_data)
{
    std::ofstream out{filename, std::ofstream::binary};

    if (!out.is_open())
        throw std::runtime_error("unable to open output file");

    for (auto col : image_data)
        out << col.r << col.g << col.b;
}